

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# World.cpp
# Opt level: O0

aphy_error __thiscall
APhyBullet::BulletWorld::addRigidBodyWithFilter
          (BulletWorld *this,collision_object_ref *object,aphy_short collision_filter_group,
          aphy_short collision_filter_mask)

{
  bool bVar1;
  btRigidBody *pbVar2;
  short in_CX;
  short in_DX;
  ref *in_RSI;
  long in_RDI;
  btRigidBody *rigidBody;
  btCollisionObject *in_stack_ffffffffffffffb8;
  value_type *in_stack_ffffffffffffffc8;
  undefined1 in_stack_ffffffffffffffd0;
  undefined7 in_stack_ffffffffffffffd1;
  undefined4 local_4;
  
  bVar1 = aphy::ref::operator_cast_to_bool(in_RSI);
  if (bVar1) {
    aphy::ref<aphy::collision_object>::as<APhyBullet::BulletCollisionObject>
              ((ref<aphy::collision_object> *)in_RSI);
    pbVar2 = btRigidBody::upcast(in_stack_ffffffffffffffb8);
    if (pbVar2 == (btRigidBody *)0x0) {
      local_4 = APHY_INVALID_PARAMETER;
    }
    else {
      (**(code **)(**(long **)(in_RDI + 0x10) + 0xb0))
                (*(long **)(in_RDI + 0x10),pbVar2,(int)in_DX,(int)in_CX);
      std::
      unordered_set<aphy::ref<aphy::collision_object>,_std::hash<aphy::ref<aphy::collision_object>_>,_std::equal_to<aphy::ref<aphy::collision_object>_>,_std::allocator<aphy::ref<aphy::collision_object>_>_>
      ::insert((unordered_set<aphy::ref<aphy::collision_object>,_std::hash<aphy::ref<aphy::collision_object>_>,_std::equal_to<aphy::ref<aphy::collision_object>_>,_std::allocator<aphy::ref<aphy::collision_object>_>_>
                *)CONCAT71(in_stack_ffffffffffffffd1,in_stack_ffffffffffffffd0),
               in_stack_ffffffffffffffc8);
      local_4 = APHY_OK;
    }
  }
  else {
    local_4 = APHY_NULL_POINTER;
  }
  return local_4;
}

Assistant:

aphy_error BulletWorld::addRigidBodyWithFilter(const collision_object_ref &object, aphy_short collision_filter_group, aphy_short collision_filter_mask)
{
    CHECK_POINTER(object);

    auto rigidBody = btRigidBody::upcast(object.as<BulletCollisionObject>()->handle);
    if(!rigidBody)
        return APHY_INVALID_PARAMETER;

    handle->addRigidBody(rigidBody, collision_filter_group, collision_filter_mask);

    collisionObjects.insert(object);
    return APHY_OK;
}